

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O0

int minfit(double *AB,int M,int N,int P,double *q)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  void *__ptr;
  double dVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_d0;
  double local_c8;
  double *e;
  double z;
  double y;
  double c;
  double tol;
  double h;
  double f;
  double temp;
  double s;
  double x;
  double g;
  double eps;
  int n1;
  int np;
  int l1;
  int iter;
  int cancel;
  int ierr;
  int t2;
  int t;
  int l;
  int k;
  int j;
  int i;
  double *q_local;
  int P_local;
  int N_local;
  int M_local;
  double *AB_local;
  
  __ptr = malloc((long)N << 3);
  dVar7 = macheps();
  s = 0.0;
  x = 0.0;
  iVar3 = N + P;
  for (k = 0; k < N; k = k + 1) {
    t2 = k + 1;
    *(double *)((long)__ptr + (long)k * 8) = x;
    temp = 0.0;
    for (t = k; t < M; t = t + 1) {
      temp = AB[t * iVar3 + k] * AB[t * iVar3 + k] + temp;
    }
    if (dVar7 * dVar7 <= temp) {
      dVar8 = AB[k * iVar3 + k];
      if (0.0 <= dVar8) {
        local_c8 = sqrt(temp);
        local_c8 = -local_c8;
      }
      else {
        local_c8 = sqrt(temp);
      }
      x = local_c8;
      dVar5 = -temp;
      AB[k * iVar3 + k] = dVar8 - local_c8;
      for (l = t2; l < iVar3; l = l + 1) {
        temp = 0.0;
        for (t = k; t < M; t = t + 1) {
          temp = AB[t * iVar3 + k] * AB[t * iVar3 + l] + temp;
        }
        for (t = k; t < M; t = t + 1) {
          iVar4 = t * iVar3 + l;
          AB[iVar4] = (temp / (dVar8 * local_c8 + dVar5)) * AB[t * iVar3 + k] + AB[iVar4];
        }
      }
    }
    else {
      x = 0.0;
    }
    q[k] = x;
    temp = 0.0;
    iVar4 = k * iVar3;
    t = t2;
    if (k < M) {
      for (; t < N; t = t + 1) {
        temp = AB[iVar4 + t] * AB[iVar4 + t] + temp;
      }
    }
    if (dVar7 * dVar7 <= temp) {
      dVar8 = AB[iVar4 + k + 1];
      if (0.0 <= dVar8) {
        local_d0 = sqrt(temp);
        local_d0 = -local_d0;
      }
      else {
        local_d0 = sqrt(temp);
      }
      x = local_d0;
      AB[iVar4 + k + 1] = dVar8 - local_d0;
      for (t = t2; l = t2, t < N; t = t + 1) {
        *(double *)((long)__ptr + (long)t * 8) = AB[iVar4 + t] / (dVar8 * local_d0 + -temp);
      }
      for (; l < M; l = l + 1) {
        temp = 0.0;
        for (t = t2; iVar6 = t2, t < N; t = t + 1) {
          temp = AB[l * iVar3 + t] * AB[iVar4 + t] + temp;
        }
        while (t = iVar6, t < N) {
          iVar6 = l * iVar3 + t;
          AB[iVar6] = temp * *(double *)((long)__ptr + (long)t * 8) + AB[iVar6];
          iVar6 = t + 1;
        }
      }
    }
    else {
      x = 0.0;
    }
    dVar8 = ABS(q[k]) + ABS(*(double *)((long)__ptr + (long)k * 8));
    if (s < dVar8) {
      s = dVar8;
    }
  }
  for (k = N + -1; -1 < k; k = k + -1) {
    iVar4 = k * iVar3;
    if ((x != 0.0) || (NAN(x))) {
      dVar8 = AB[iVar4 + k + 1];
      for (l = t2; l < N; l = l + 1) {
        AB[l * iVar3 + k] = AB[iVar4 + l] / (dVar8 * x);
      }
      for (l = t2; l < N; l = l + 1) {
        temp = 0.0;
        for (t = t2; t < N; t = t + 1) {
          temp = AB[iVar4 + t] * AB[t * iVar3 + l] + temp;
        }
        for (t = t2; t < N; t = t + 1) {
          iVar6 = t * iVar3 + l;
          AB[iVar6] = temp * AB[t * iVar3 + k] + AB[iVar6];
        }
      }
    }
    for (l = t2; l < N; l = l + 1) {
      AB[l * iVar3 + k] = 0.0;
      AB[iVar4 + l] = 0.0;
    }
    AB[iVar4 + k] = 1.0;
    x = *(double *)((long)__ptr + (long)k * 8);
    t2 = k;
  }
  dVar7 = dVar7 * s;
  for (k = M; l = N, k < N; k = k + 1) {
    for (; l < iVar3; l = l + 1) {
      AB[k * iVar3 + l] = 0.0;
    }
  }
  t = N + -1;
LAB_0015a2b6:
  if (t < 0) {
    free(__ptr);
    return 0;
  }
  np = 0;
  do {
    np = np + 1;
    if (0x32 < np) {
      printf("Convergence Not Achieved \n");
      return 0xf;
    }
    bVar2 = true;
    for (t2 = t; -1 < t2; t2 = t2 + -1) {
      if (ABS(*(double *)((long)__ptr + (long)t2 * 8)) <= dVar7) {
        bVar2 = false;
        break;
      }
      if (ABS(q[t2 + -1]) <= dVar7) break;
    }
    if (bVar2) {
      y = 0.0;
      temp = 1.0;
      for (k = t2; k <= t; k = k + 1) {
        dVar8 = temp * *(double *)((long)__ptr + (long)k * 8);
        *(double *)((long)__ptr + (long)k * 8) = y * *(double *)((long)__ptr + (long)k * 8);
        if (ABS(dVar8) <= dVar7) break;
        dVar5 = q[k];
        dVar9 = hypot(dVar8,dVar5);
        q[k] = dVar9;
        y = dVar5 / dVar9;
        temp = -dVar8 / dVar9;
        for (l = N; l < iVar3; l = l + 1) {
          dVar8 = AB[(t2 + -1) * iVar3 + l];
          dVar5 = AB[k * iVar3 + l];
          AB[(t2 + -1) * iVar3 + l] = dVar8 * y + dVar5 * temp;
          AB[k * iVar3 + l] = dVar5 * y + -(dVar8 * temp);
        }
      }
    }
    dVar8 = q[t];
    if (t2 == t) break;
    s = q[t2];
    dVar5 = q[t + -1];
    dVar9 = *(double *)((long)__ptr + (long)(t + -1) * 8);
    dVar11 = *(double *)((long)__ptr + (long)t * 8);
    dVar9 = ((((dVar9 + dVar8) / dVar11) * ((dVar9 - dVar8) / dVar5) + dVar5 / dVar11) -
            dVar11 / dVar5) * 0.5;
    dVar10 = hypot(dVar9,1.0);
    if (0.0 <= dVar9) {
      f = dVar9 + dVar10;
    }
    else {
      f = dVar9 - dVar10;
    }
    h = (dVar11 / s) * (dVar5 / f - dVar11) + -(dVar8 / s) * dVar8 + s;
    temp = 1.0;
    y = 1.0;
    iVar4 = t2;
    while (iVar6 = iVar4, k = iVar6 + 1, k <= t) {
      dVar8 = *(double *)((long)__ptr + (long)k * 8);
      dVar5 = q[k];
      dVar9 = temp * dVar8;
      dVar8 = y * dVar8;
      dVar11 = hypot(h,dVar9);
      *(double *)((long)__ptr + (long)iVar6 * 8) = dVar11;
      y = h / dVar11;
      temp = dVar9 / dVar11;
      dVar9 = s * y + dVar8 * temp;
      dVar8 = dVar8 * y + -(s * temp);
      dVar11 = dVar5 * temp;
      dVar5 = y * dVar5;
      for (l = 0; l < N; l = l + 1) {
        iVar4 = l * iVar3;
        dVar10 = AB[iVar4 + k + -1];
        dVar1 = AB[iVar4 + k];
        AB[iVar4 + k + -1] = dVar10 * y + dVar1 * temp;
        AB[iVar4 + k] = dVar1 * y + -(dVar10 * temp);
      }
      dVar10 = hypot(dVar9,dVar11);
      q[iVar6] = dVar10;
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        y = dVar9 / dVar10;
        temp = dVar11 / dVar10;
      }
      h = y * dVar8 + temp * dVar5;
      s = y * dVar5 + -(temp * dVar8);
      for (l = N; iVar4 = k, l < iVar3; l = l + 1) {
        dVar8 = AB[iVar6 * iVar3 + l];
        dVar5 = AB[k * iVar3 + l];
        AB[iVar6 * iVar3 + l] = dVar8 * y + dVar5 * temp;
        AB[k * iVar3 + l] = dVar5 * y + -(dVar8 * temp);
      }
    }
    *(undefined8 *)((long)__ptr + (long)t2 * 8) = 0;
    *(double *)((long)__ptr + (long)t * 8) = h;
    q[t] = s;
  } while( true );
  if (dVar8 < 0.0) {
    q[t] = -dVar8;
    for (l = 0; l < N; l = l + 1) {
      AB[l * iVar3 + t] = -AB[l * iVar3 + t];
    }
  }
  t = t + -1;
  goto LAB_0015a2b6;
}

Assistant:

int minfit(double *AB,int M,int N,int P,double *q) {
	int i,j,k,l,t,t2,ierr,cancel,iter,l1,np,n1;
	double eps,g,x,s,temp,f,h,tol,c,y,z;
	double *e;
	/*
     THIS SUBROUTINE IS THE MODIFIED C TRANSLATION OF THE
     EISPACK FORTRAN TRANSLATION OF THE ALGOL PROCEDURE MINFIT,
     NUM. MATH. 14, 403-420(1970) BY GOLUB AND REINSCH.
     HANDBOOK FOR AUTO. COMP., VOL II-LINEAR ALGEBRA, 134-151(1971).
	 */
	/*
	 * AB MAX(M,N) X (N+P)
	 * q N X 1
	 *
	 * On Input AB = [A:B]
	 * On Output AB = [V:C] where C = U'*B
	 */

	e = (double*) malloc(sizeof(double) * N);
	ierr = 0;
	eps = macheps();
	tol = eps * eps;
	g = x = 0.0;
	np = N + P;

	for(i = 0; i < N;++i) {
		l = i+1;
		e[i] = g;
		s = 0.0;

		for(k = i; k < M;++k) {
			t = k * np;
			temp = AB[t+i];
			s += temp*temp;
		}
		if (s < tol) {
			g = 0.0;
		} else {
			f = AB[i*np+i];
			g = (f < 0) ? sqrt(s) : -sqrt(s);
			h = f * g - s;
			AB[i*np+i] = f - g;

			for(j = l; j < np;++j) {
				s = 0.0;
				for(k = i; k < M;++k) {
					t = k * np;
					s += (AB[t+i]*AB[t+j]);
				}
				f = s / h;
				for(k = i; k < M;++k) {
					t = k * np;
					AB[t+j] += (f * AB[t+i]);
				}
			}

		}

        q[i] = g;
        s = 0.0;
        t = i * np;
        if (i < M) {
			for(k = l; k < N;++k) {
				temp = AB[t+k];
				s = s + temp*temp;
			}
        }
        if (s < tol) {
        	g = 0.0;
        } else {
        	f = AB[t+i+1];
			g = (f < 0) ? sqrt(s) : -sqrt(s);
			h = f * g - s;
            AB[t+i+1] = f - g;
            for(k = l;k < N;++k) {
              	e[k] = AB[t+k] / h;
            }

            for (j = l; j < M; j++) {
                s = 0.0;
                t2 = j * np;
                for (k = l; k < N; k++) {
                     s += AB[t2+k] * AB[t+k];
                }
                for (k = l; k < N; k++) {
                     AB[t2+k] += s * e[k];
                }
            }

        }

        temp = fabs(q[i]) + fabs(e[i]);

        if (x < temp) {
        	x = temp;
        }
	}

	//Accumulating Right Hand Transformations

	for(i = N - 1;i >= 0;--i) {
		t = i * np;
		if (g != 0.0) {
			h = AB[t+i+1] * g;
			for(j = l;j < N;++j) {
				AB[j*np+i] = AB[t+j] / h;
			}
			for(j = l;j < N;++j) {
				s = 0.0;
				for(k = l; k < N;++k) {
					s += AB[t+k] * AB[k*np+j];
				}
				for(k = l; k < N;++k) {
					AB[k*np+j] += (s * AB[k*np+i]);
				}
			}
		}
		for(j = l; j < N;++j) {
			AB[t+j] = AB[j*np+i] = 0.0;
		}

		AB[t+i] = 1.0;
		g = e[i];
		l = i;
	}

	eps = eps *x;
	n1 = N + 1;

	for(i = M; i < N;++i) {
		for(j = n1 - 1; j < np;++j)  {
			AB[i * np +j] = 0.0;
		}
	}

	for(k = N - 1; k >= 0; --k) {
		iter = 0;

		while(1) {
			iter++;
			if (iter > SVDMAXITER) {
				printf("Convergence Not Achieved \n");
				return 15;
			}

			cancel = 1;
			for(l = k; l >= 0; --l) {
				if (fabs(e[l]) <= eps) {
					cancel = 0; //test f convergence
					break;
				}
				if (fabs(q[l-1]) <= eps) {
					//Cancel
					break;
				}
			}
			if (cancel) {
				c = 0.0;
				s = 1.0;
				l1 = l - 1;
				for(i = l; i <= k;++i) {
					f = s*e[i];
					e[i] *= c;
					if (fabs(f) <= eps) {
						break;
					}
					g = q[i];
					h = q[i] = hypot(f,g);
					c = g/h;
					s = -f/h;
					for(j = n1-1; j < np;++j) {
						y = AB[l1 * np + j];
						z = AB[i * np + j];

						AB[l1 * np + j] = y * c + z * s;
						AB[i * np + j] = z * c - y * s;
					}
				}
			}
			z = q[k];
			if (l != k) {
				x = q[l];
				y = q[k-1];
				g = e[k-1];
				h = e[k];
				f = 0.5 * (((g + z) / h) * ((g - z) / y) + y / h - h / y);
				g = hypot(f,1.0);
				if (f < 0.0) {
					temp = f - g;
				} else {
					temp = f+g;
				}
				f = x - (z / x) * z + (h / x) * (y / temp - h);

				//Next QR Transformation

				c = s = 1.0;
				for(i = l+1; i <= k;++i) {
					g = e[i];
					y = q[i];
					h = s * g;
					g = c * g;
					e[i-1] = z = hypot(f,h);
                    c = f / z;
                    s = h / z;
                    f = x * c + g * s;
                    g = g * c - x * s;
                    h = y * s;
                    y *= c;
                    for(j = 0; j < N;++j) {
                    	t = j * np;
                        x = AB[t+i-1];
                        z = AB[t+i];
                        AB[t+i-1] = x * c + z * s;
                        AB[t+i] = z * c - x * s;
                    }
                    q[i-1] = z = hypot(f,h);
                    if (z != 0.0) {
                        c = f / z;
                        s = h / z;
                    }
                    f = c * g + s * y;
                    x = c * y - s * g;
                    for(j = n1-1; j < np;++j) {
                        y = AB[(i-1) * np + j];
                        z = AB[i * np + j];
                        AB[(i-1) * np + j] = y * c + z * s;
                        AB[i * np + j] = z * c - y * s;
                    }
				}
                    e[l] = 0.0;
                    e[k] = f;
                    q[k] = x;

			} else {
				//convergence
                if (z < 0.0) {
                    q[k] = -z;
                    for (j = 0; j < N; j++) {
                    	t = j * np;
                        AB[t+k] = -AB[t+k];
                    }
                }
                break;
			}
		}
	}

	free(e);
	return ierr;

}